

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::JoinHashTable::ScanStructure::ConstructMarkJoinResult
          (ScanStructure *this,DataChunk *join_keys,DataChunk *child,DataChunk *result)

{
  data_ptr_t pdVar1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  reference pvVar3;
  reference pvVar4;
  ulong uVar5;
  idx_t i_1;
  ulong uVar6;
  idx_t i;
  ulong uVar7;
  idx_t i_3;
  reference rVar8;
  UnifiedVectorFormat jdata;
  
  result->count = child->count;
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)(child->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(child->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar7 = uVar7 + 1) {
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&result->data,uVar7);
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&child->data,uVar7);
    Vector::Reference(pvVar3,pvVar4);
  }
  pvVar3 = vector<duckdb::Vector,_true>::back(&result->data);
  Vector::SetVectorType(pvVar3,FLAT_VECTOR);
  pdVar1 = pvVar3->data;
  FlatVector::VerifyFlatVector(pvVar3);
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)(join_keys->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(join_keys->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar7 = uVar7 + 1) {
    rVar8 = vector<bool,_true>::get<true>(&this->ht->null_values_are_equal,uVar7);
    if ((*rVar8._M_p & rVar8._M_mask) == 0) {
      UnifiedVectorFormat::UnifiedVectorFormat(&jdata);
      pvVar4 = vector<duckdb::Vector,_true>::get<true>(&join_keys->data,uVar7);
      Vector::ToUnifiedFormat(pvVar4,join_keys->count,&jdata);
      if (jdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        for (uVar6 = 0; uVar6 < join_keys->count; uVar6 = uVar6 + 1) {
          uVar5 = uVar6;
          if ((jdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar5 = (ulong)(jdata.sel)->sel_vector[uVar6];
          }
          if ((jdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6]
               >> (uVar5 & 0x3f) & 1) == 0) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(pvVar3->validity).super_TemplatedValidityMask<unsigned_long>,uVar6);
          }
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&jdata);
    }
  }
  uVar7 = child->count;
  _Var2._M_head_impl =
       (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    pdVar1[uVar6] = _Var2._M_head_impl[uVar6];
  }
  if (this->ht->has_null == true) {
    for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 1) {
      if (pdVar1[uVar6] == '\0') {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&(pvVar3->validity).super_TemplatedValidityMask<unsigned_long>,uVar6);
        uVar7 = child->count;
      }
    }
  }
  return;
}

Assistant:

void ScanStructure::ConstructMarkJoinResult(DataChunk &join_keys, DataChunk &child, DataChunk &result) {
	// for the initial set of columns we just reference the left side
	result.SetCardinality(child);
	for (idx_t i = 0; i < child.ColumnCount(); i++) {
		result.data[i].Reference(child.data[i]);
	}
	auto &mark_vector = result.data.back();
	mark_vector.SetVectorType(VectorType::FLAT_VECTOR);
	// first we set the NULL values from the join keys
	// if there is any NULL in the keys, the result is NULL
	auto bool_result = FlatVector::GetData<bool>(mark_vector);
	auto &mask = FlatVector::Validity(mark_vector);
	for (idx_t col_idx = 0; col_idx < join_keys.ColumnCount(); col_idx++) {
		if (ht.null_values_are_equal[col_idx]) {
			continue;
		}
		UnifiedVectorFormat jdata;
		join_keys.data[col_idx].ToUnifiedFormat(join_keys.size(), jdata);
		if (!jdata.validity.AllValid()) {
			for (idx_t i = 0; i < join_keys.size(); i++) {
				auto jidx = jdata.sel->get_index(i);
				if (!jdata.validity.RowIsValidUnsafe(jidx)) {
					mask.SetInvalid(i);
				}
			}
		}
	}
	// now set the remaining entries to either true or false based on whether a match was found
	D_ASSERT(found_match);
	for (idx_t i = 0; i < child.size(); i++) {
		bool_result[i] = found_match[i];
	}
	// if the right side contains NULL values, the result of any FALSE becomes NULL
	if (ht.has_null) {
		for (idx_t i = 0; i < child.size(); i++) {
			if (!bool_result[i]) {
				mask.SetInvalid(i);
			}
		}
	}
}